

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O1

void alloc_cb(uv_handle_t *handle,size_t size,uv_buf_t *buf)

{
  buf->base = slab;
  buf->len = 1;
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  size_t buffer_size;
  CHECK_HANDLE(handle);

  /* Only allocate enough room for multiple dgrams if we can actually recv them */
  buffer_size = MAX_DGRAM_SIZE;
  if (uv_udp_using_recvmmsg((uv_udp_t*)handle))
    buffer_size *= BUFFER_MULTIPLIER;

  /* Actually malloc to exercise free'ing the buffer later */
  buf->base = malloc(buffer_size);
  ASSERT_NOT_NULL(buf->base);
  buf->len = buffer_size;
  alloc_cb_called++;
}